

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btDbvt.cpp
# Opt level: O0

void recursedeletenode(btDbvt *pdbvt,btDbvtNode *node)

{
  bool bVar1;
  btDbvt *in_RSI;
  long *in_RDI;
  btDbvtNode *in_stack_ffffffffffffffe8;
  
  bVar1 = btDbvtNode::isleaf((btDbvtNode *)in_RSI);
  if (!bVar1) {
    recursedeletenode(in_RSI,in_stack_ffffffffffffffe8);
    recursedeletenode(in_RSI,in_stack_ffffffffffffffe8);
  }
  if (in_RSI == (btDbvt *)*in_RDI) {
    *in_RDI = 0;
  }
  deletenode(in_RSI,in_stack_ffffffffffffffe8);
  return;
}

Assistant:

static void						recursedeletenode(	btDbvt* pdbvt,
												  btDbvtNode* node)
{
	if(!node->isleaf())
	{
		recursedeletenode(pdbvt,node->childs[0]);
		recursedeletenode(pdbvt,node->childs[1]);
	}
	if(node==pdbvt->m_root) pdbvt->m_root=0;
	deletenode(pdbvt,node);
}